

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_kfold_strto(jit_State *J)

{
  int iVar1;
  TRef TVar2;
  TValue n;
  TValue local_10;
  
  iVar1 = lj_strscan_num((GCstr *)(J->fold).left[1],&local_10);
  if (iVar1 == 0) {
    TVar2 = 3;
  }
  else {
    TVar2 = lj_ir_knum_u64(J,local_10.u64);
  }
  return TVar2;
}

Assistant:

LJFOLD(STRTO KGC)
LJFOLDF(kfold_strto)
{
  TValue n;
  if (lj_strscan_num(ir_kstr(fleft), &n))
    return lj_ir_knum(J, numV(&n));
  return FAILFOLD;
}